

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_number_table.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ValueNumberTable::BuildDominatorTreeValueNumberTable(ValueNumberTable *this)

{
  Module *pMVar1;
  Instruction *pIVar2;
  pointer puVar3;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  _Var4;
  long *plVar5;
  long lVar6;
  uint32_t uVar7;
  long *plVar8;
  Instruction *inst;
  Instruction **ppIVar9;
  pointer puVar10;
  
  pMVar1 = (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar9 = (Instruction **)
            ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (pIVar2 = *ppIVar9,
        pIVar2 != (Instruction *)
                  ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> +
                  8U)) {
    uVar7 = Instruction::result_id(pIVar2);
    if (uVar7 != 0) {
      AssignValueNumber(this,pIVar2);
    }
    ppIVar9 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  pMVar1 = (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar9 = (Instruction **)
            ((long)&(pMVar1->capabilities_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (pIVar2 = *ppIVar9,
        pIVar2 != (Instruction *)
                  ((long)&(pMVar1->capabilities_).super_IntrusiveList<spvtools::opt::Instruction> +
                  8U)) {
    uVar7 = Instruction::result_id(pIVar2);
    if (uVar7 != 0) {
      AssignValueNumber(this,pIVar2);
    }
    ppIVar9 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  pMVar1 = (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar9 = (Instruction **)
            ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (pIVar2 = *ppIVar9,
        pIVar2 != (Instruction *)
                  ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> +
                  8U)) {
    uVar7 = Instruction::result_id(pIVar2);
    if (uVar7 != 0) {
      AssignValueNumber(this,pIVar2);
    }
    ppIVar9 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  pMVar1 = (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar9 = (Instruction **)
            ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> +
            0x10);
  while (pIVar2 = *ppIVar9,
        pIVar2 != (Instruction *)
                  ((long)&(pMVar1->ext_inst_imports_).
                          super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
    uVar7 = Instruction::result_id(pIVar2);
    if (uVar7 != 0) {
      AssignValueNumber(this,pIVar2);
    }
    ppIVar9 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  pMVar1 = (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar9 = (Instruction **)
            ((long)&(pMVar1->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
            0x10);
  while (pIVar2 = *ppIVar9,
        pIVar2 != (Instruction *)
                  ((long)&(pMVar1->ext_inst_debuginfo_).
                          super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
    uVar7 = Instruction::result_id(pIVar2);
    if (uVar7 != 0) {
      AssignValueNumber(this,pIVar2);
    }
    ppIVar9 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  pMVar1 = (this->context_->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar3 = *(pointer *)
            ((long)&(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  for (puVar10 = *(pointer *)
                  &(pMVar1->functions_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                   ._M_impl; puVar10 != puVar3; puVar10 = puVar10 + 1) {
    _Var4.
    super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
    _M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
    .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
         (puVar10->_M_t).
         super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
    ;
    plVar5 = *(long **)((long)_Var4.
                              super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                              .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl
                       + 0xa0);
    for (plVar8 = *(long **)((long)_Var4.
                                   super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                                   .super__Head_base<0UL,_spvtools::opt::Function_*,_false>.
                                   _M_head_impl + 0x98); plVar8 != plVar5; plVar8 = plVar8 + 1) {
      lVar6 = *plVar8;
      ppIVar9 = (Instruction **)(lVar6 + 0x20);
      while (pIVar2 = *ppIVar9, pIVar2 != (Instruction *)(lVar6 + 0x18)) {
        uVar7 = Instruction::result_id(pIVar2);
        if (uVar7 != 0) {
          AssignValueNumber(this,pIVar2);
        }
        ppIVar9 = &(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      }
    }
  }
  return;
}

Assistant:

void ValueNumberTable::BuildDominatorTreeValueNumberTable() {
  // First value number the headers.
  for (auto& inst : context()->annotations()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->capabilities()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->types_values()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->module()->ext_inst_imports()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (auto& inst : context()->module()->ext_inst_debuginfo()) {
    if (inst.result_id() != 0) {
      AssignValueNumber(&inst);
    }
  }

  for (Function& func : *context()->module()) {
    // For best results we want to traverse the code in reverse post order.
    // This happens naturally because of the forward referencing rules.
    for (BasicBlock& block : func) {
      for (Instruction& inst : block) {
        if (inst.result_id() != 0) {
          AssignValueNumber(&inst);
        }
      }
    }
  }
}